

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_with(REF_CELL ref_cell,REF_INT *nodes,REF_INT *cell)

{
  uint uVar1;
  REF_INT local_1a0;
  REF_INT local_19c;
  int local_198;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT orig [27];
  REF_INT candidate [27];
  REF_INT ncandidate;
  REF_INT target [27];
  REF_INT ntarget;
  REF_INT same;
  REF_INT node;
  REF_INT ref;
  REF_INT item;
  REF_INT *cell_local;
  REF_INT *nodes_local;
  REF_CELL ref_cell_local;
  
  *cell = -1;
  ref_cell_local._4_4_ =
       ref_sort_unique_int(ref_cell->node_per,nodes,target + 0x19,candidate + 0x1a);
  if (ref_cell_local._4_4_ == 0) {
    if ((*nodes < 0) || (ref_cell->ref_adj->nnode <= *nodes)) {
      local_198 = -1;
    }
    else {
      local_198 = ref_cell->ref_adj->first[*nodes];
    }
    node = local_198;
    if (local_198 == -1) {
      local_19c = -1;
    }
    else {
      local_19c = ref_cell->ref_adj->item[local_198].ref;
    }
    same = local_19c;
    while (node != -1) {
      uVar1 = ref_cell_nodes(ref_cell,same,&ref_private_macro_code_rss_1);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x4a9,"ref_cell_with",(ulong)uVar1,"get orig");
        return uVar1;
      }
      uVar1 = ref_sort_unique_int(ref_cell->node_per,&ref_private_macro_code_rss_1,candidate + 0x19,
                                  orig + 0x1a);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x4ac,"ref_cell_with",(ulong)uVar1,"canonical");
        return uVar1;
      }
      if (target[0x19] == candidate[0x19]) {
        target[0x1a] = 0;
        for (ntarget = 0; ntarget < target[0x19]; ntarget = ntarget + 1) {
          if (candidate[(long)ntarget + 0x1a] == orig[(long)ntarget + 0x1a]) {
            target[0x1a] = target[0x1a] + 1;
          }
        }
        if (target[0x19] == target[0x1a]) {
          *cell = same;
          return 0;
        }
      }
      node = ref_cell->ref_adj->item[node].next;
      if (node == -1) {
        local_1a0 = -1;
      }
      else {
        local_1a0 = ref_cell->ref_adj->item[node].ref;
      }
      same = local_1a0;
    }
    ref_cell_local._4_4_ = 5;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x4a6,
           "ref_cell_with",(ulong)ref_cell_local._4_4_,"canonical");
  }
  return ref_cell_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cell_with(REF_CELL ref_cell, REF_INT *nodes,
                                 REF_INT *cell) {
  REF_INT item, ref, node, same;
  REF_INT ntarget, target[REF_CELL_MAX_SIZE_PER];
  REF_INT ncandidate, candidate[REF_CELL_MAX_SIZE_PER];
  REF_INT orig[REF_CELL_MAX_SIZE_PER];

  (*cell) = REF_EMPTY;

  RSS(ref_sort_unique_int(ref_cell_node_per(ref_cell), nodes, &ntarget, target),
      "canonical");

  each_ref_adj_node_item_with_ref(ref_cell_adj(ref_cell), nodes[0], item, ref) {
    RSS(ref_cell_nodes(ref_cell, ref, orig), "get orig");
    RSS(ref_sort_unique_int(ref_cell_node_per(ref_cell), orig, &ncandidate,
                            candidate),
        "canonical");
    if (ntarget == ncandidate) {
      same = 0;
      for (node = 0; node < ntarget; node++)
        if (target[node] == candidate[node]) same++;
      if (ntarget == same) {
        (*cell) = ref;
        return REF_SUCCESS;
      }
    }
  }

  return REF_NOT_FOUND;
}